

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

uint __thiscall
ON_SubDSectorType::GetSurfaceEvaluationCoefficients
          (ON_SubDSectorType *this,double *LP,size_t LP_capacity,double *L1,size_t L1_capacity,
          double *L2,size_t L2_capacity)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_SubDVertexTag OVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  ulong local_2d0;
  double local_2c8;
  double local_2b8;
  double local_290;
  uint local_254;
  uint local_250;
  uint i_13;
  uint i_12;
  uint i_11;
  uint i_10;
  uint i_9;
  double s;
  uint i_8;
  uint angle_index;
  uint i1_1;
  uint i0_1;
  uint i_7;
  double x;
  double int_tol;
  uint i_6;
  double EtoL [2] [2];
  double det;
  double E [2] [2];
  uint lambda_multiplicity_1;
  double lambda_local_1;
  uint i_5;
  uint i_4;
  double LPsum;
  double *q1;
  double *q0;
  uint local_180;
  uint i1;
  uint i0;
  uint i_3;
  uint i_2;
  uint lambda_multiplicity;
  double lambda_local;
  double eigenpivots [3];
  double local_148;
  double eigenprecision [2];
  double *eigenvectors [2];
  double *termination_tolerances;
  _func_int *local_108;
  double *E2;
  double *E1;
  double **S;
  ON_Matrix Sbuffer;
  uint local_a0;
  uint i_1;
  uint i;
  bool b180degreeCorner;
  double sin1;
  double sin0;
  double cos1;
  double cos0;
  double z;
  double y;
  double q;
  double p;
  double dF;
  uint F;
  uint R;
  double lambda;
  double *L2_local;
  size_t L1_capacity_local;
  double *L1_local;
  size_t LP_capacity_local;
  double *LP_local;
  ON_SubDSectorType *this_local;
  
  lambda = (double)L2;
  L2_local = (double *)L1_capacity;
  L1_capacity_local = (size_t)L1;
  L1_local = (double *)LP_capacity;
  LP_capacity_local = (size_t)LP;
  LP_local = (double *)this;
  _F = SubdominantEigenvalue(this);
  if ((_F <= 0.0) || (1.0 <= _F)) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  dF._4_4_ = PointRingCount(this);
  if (dF._4_4_ < 3) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  dF._0_4_ = FaceCount(this);
  if (dF._0_4_ == 0) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  p = (double)dF._0_4_;
  if (L1_local == (double *)0x0) {
    LP_capacity_local = 0;
  }
  else if ((L1_local < (double *)(ulong)dF._4_4_) || (LP_capacity_local == 0)) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  if (L2_local == (double *)0x0) {
    L1_capacity_local = 0;
  }
  else if ((L2_local < (double *)(ulong)dF._4_4_) || (L1_capacity_local == 0)) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  if (L2_capacity == 0) {
    lambda = 0.0;
  }
  else if ((L2_capacity < dF._4_4_) || (lambda == 0.0)) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  if (((L1_capacity_local == 0) || (lambda == 0.0)) && ((L1_capacity_local != 0 || (lambda != 0.0)))
     ) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  bVar6 = false;
  OVar5 = VertexTag(this);
  switch(OVar5) {
  case Unset:
    break;
  case Smooth:
    if ((4 < dF._4_4_) && ((dF._4_4_ & 1) == 1)) {
      if (LP_capacity_local != 0) {
        *(double *)LP_capacity_local = p / (p + 5.0);
        z = p * (p + 5.0);
        q = 4.0 / z;
        y = 1.0 / z;
        for (local_a0 = 1; local_a0 < dF._4_4_; local_a0 = local_a0 + 2) {
          *(double *)(LP_capacity_local + (ulong)local_a0 * 8) = q;
          *(double *)(LP_capacity_local + (ulong)(local_a0 + 1) * 8) = y;
        }
      }
      if (L1_capacity_local != 0) {
        if (dF._4_4_ == 5) {
          *(undefined8 *)L1_capacity_local = 0;
          *(undefined8 *)(L1_capacity_local + 8) = 0x3ff0000000000000;
          *(undefined8 *)(L1_capacity_local + 0x10) = 0;
          *(undefined8 *)(L1_capacity_local + 0x18) = 0xbff0000000000000;
          *(undefined8 *)(L1_capacity_local + 0x20) = 0;
          *(undefined8 *)lambda = 0;
          *(undefined8 *)((long)lambda + 8) = 0;
          *(undefined8 *)((long)lambda + 0x10) = 0x3ff0000000000000;
          *(undefined8 *)((long)lambda + 0x18) = 0;
          *(undefined8 *)((long)lambda + 0x20) = 0xbff0000000000000;
        }
        else {
          cos1 = 1.0;
          sin1 = 0.0;
          ON_SubDMatrix::EvaluateCosAndSin(2,dF._0_4_,&sin0,(double *)&i);
          z = (((sin0 + 3.0) * -0.125 + _F) * 2.0) / (sin0 + 1.0);
          *(undefined8 *)L1_capacity_local = 0;
          *(double *)(L1_capacity_local + 8) = cos1;
          *(undefined8 *)lambda = 0;
          *(double *)((long)lambda + 8) = sin1;
          Sbuffer.m_cmem._4_4_ = 2;
          while( true ) {
            *(double *)(L1_capacity_local + (ulong)Sbuffer.m_cmem._4_4_ * 8) = z * (cos1 + sin0);
            *(double *)((long)lambda + (ulong)Sbuffer.m_cmem._4_4_ * 8) = z * (sin1 + _i);
            uVar8 = Sbuffer.m_cmem._4_4_ + 1;
            if (uVar8 == dF._4_4_) break;
            *(double *)(L1_capacity_local + (ulong)uVar8 * 8) = sin0;
            *(double *)((long)lambda + (ulong)uVar8 * 8) = _i;
            Sbuffer.m_cmem._4_4_ = Sbuffer.m_cmem._4_4_ + 2;
            cos1 = sin0;
            sin1 = _i;
            ON_SubDMatrix::EvaluateCosAndSin(Sbuffer.m_cmem._4_4_,dF._0_4_,&sin0,(double *)&i);
          }
        }
      }
      return dF._4_4_;
    }
    break;
  case Corner:
    if ((dF._4_4_ & 1) == 0) {
      uVar8 = CornerSectorAngleIndex(this);
      if ((uVar8 != 0x24) || (dF._0_4_ < 2)) {
        *(undefined8 *)LP_capacity_local = 0x3ff0000000000000;
        for (s._4_4_ = 1; s._4_4_ < dF._4_4_; s._4_4_ = s._4_4_ + 2) {
          *(undefined8 *)(LP_capacity_local + (ulong)s._4_4_ * 8) = 0;
        }
        *(undefined8 *)L1_capacity_local = 0xbff0000000000000;
        *(undefined8 *)(L1_capacity_local + 8) = 0x3ff0000000000000;
        *(undefined8 *)(L1_capacity_local + (ulong)(dF._4_4_ - 1) * 8) = 0;
        local_2d0 = 0x3ff0000000000000;
        if (0x48 < uVar8 << 1) {
          local_2d0 = 0xbff0000000000000;
        }
        *(ulong *)lambda = local_2d0 ^ 0x8000000000000000;
        *(undefined8 *)((long)lambda + 8) = 0;
        *(ulong *)((long)lambda + (ulong)(dF._4_4_ - 1) * 8) = local_2d0;
        for (i_11 = 2; i_11 + 1 < dF._4_4_; i_11 = i_11 + 1) {
          *(undefined8 *)(L1_capacity_local + (ulong)i_11 * 8) = 0;
          *(undefined8 *)((long)lambda + (ulong)i_11 * 8) = 0;
        }
        if (((uVar8 == 0x24) && (dF._0_4_ == 1)) && (dF._4_4_ == 4)) {
          *(undefined8 *)lambda = 0xbff0000000000000;
          *(undefined8 *)((long)lambda + 8) = 0;
          *(undefined8 *)((long)lambda + 0x10) = 0x3ff0000000000000;
          *(undefined8 *)((long)lambda + 0x18) = 0;
        }
        return dF._4_4_;
      }
      bVar6 = true;
    }
    if (!bVar6) break;
  case Crease:
    if ((dF._4_4_ & 1) == 0) {
      if (bVar6) {
        *(undefined8 *)LP_capacity_local = 0x3ff0000000000000;
        for (i_12 = 1; i_12 < dF._4_4_; i_12 = i_12 + 2) {
          *(undefined8 *)(LP_capacity_local + (ulong)i_12 * 8) = 0;
        }
      }
      else {
        *(undefined8 *)LP_capacity_local = 0x3fe5555555555555;
        *(undefined8 *)(LP_capacity_local + (ulong)(dF._4_4_ - 1) * 8) = 0x3fc5555555555555;
        *(undefined8 *)(LP_capacity_local + 8) = 0x3fc5555555555555;
        for (i_13 = 2; i_13 + 1 < dF._4_4_; i_13 = i_13 + 2) {
          *(undefined8 *)(LP_capacity_local + (ulong)i_13 * 8) = 0;
        }
      }
      *(undefined8 *)L1_capacity_local = 0;
      *(undefined8 *)(L1_capacity_local + 8) = 0x3ff0000000000000;
      *(undefined8 *)(L1_capacity_local + (ulong)(dF._4_4_ - 1) * 8) = 0xbff0000000000000;
      for (local_250 = 2; local_250 + 1 < dF._4_4_; local_250 = local_250 + 1) {
        *(undefined8 *)(L1_capacity_local + (ulong)local_250 * 8) = 0;
      }
      if (dF._0_4_ == 1) {
        *(undefined8 *)lambda = 0xc000000000000000;
        *(undefined8 *)((long)lambda + 8) = 0x3ff0000000000000;
        *(undefined8 *)((long)lambda + 0x10) = 0;
        *(undefined8 *)((long)lambda + 0x18) = 0x3ff0000000000000;
      }
      else {
        cos1 = 1.0;
        sin1 = 0.0;
        ON_SubDMatrix::EvaluateCosAndSin(1,dF._0_4_,&sin0,(double *)&i);
        cos0 = (sin0 + 1.0) / _i;
        *(double *)lambda = -_i;
        *(double *)((long)lambda + 8) = cos0 * -0.25 * (sin0 + sin0 + 1.0);
        *(double *)((long)lambda + 0x10) = (sin1 + _i) * 0.25;
        *(undefined8 *)((long)lambda + (ulong)(dF._4_4_ - 1) * 8) =
             *(undefined8 *)((long)lambda + 8);
        local_254 = 3;
        do {
          cos1 = sin0;
          sin1 = _i;
          ON_SubDMatrix::EvaluateCosAndSin((local_254 >> 1) + 1,dF._0_4_,&sin0,(double *)&i);
          *(double *)((long)lambda + (ulong)local_254 * 8) = sin1;
          *(double *)((long)lambda + (ulong)(local_254 + 1) * 8) = (sin1 + _i) * 0.25;
          local_254 = local_254 + 2;
        } while (local_254 < dF._4_4_ - 1);
      }
      return dF._4_4_;
    }
    break;
  case Dart:
    if ((dF._4_4_ & 1) != 1) break;
    ON_Matrix::ON_Matrix((ON_Matrix *)&S);
    E1 = (double *)0x0;
    E2 = (double *)0x0;
    local_108 = (_func_int *)0x0;
    if (5 < dF._0_4_) {
      bVar6 = ON_Matrix::Create((ON_Matrix *)&S,dF._4_4_ + 2,dF._4_4_);
      uVar8 = dF._4_4_;
      if (!bVar6) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      uVar7 = GetSubdivisionMatrix(this,(double **)Sbuffer._vptr_ON_Matrix,(ulong)dF._4_4_);
      if (uVar8 != uVar7) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      E1 = (double *)Sbuffer._vptr_ON_Matrix;
      E2 = (double *)Sbuffer._vptr_ON_Matrix[dF._4_4_];
      local_108 = Sbuffer._vptr_ON_Matrix[dF._4_4_ + 1];
    }
    eigenprecision[1] = (double)E2;
    memset(&local_148,0,0x10);
    memset(&lambda_local,0,0x18);
    if (LP_capacity_local != 0) {
      if (dF._0_4_ - 2 < 3 || dF._0_4_ == 5) {
        uVar8 = (*(code *)(&DAT_00a0ff6c + *(int *)(&DAT_00a0ff6c + (ulong)(dF._0_4_ - 2) * 4)))();
        return uVar8;
      }
      if (E1 == (double *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      uVar8 = ON_GetEigenvectors(dF._4_4_,(double **)E1,true,1.0,1,(double *)0x0,
                                 (double **)(eigenprecision + 1),&local_148,&lambda_local);
      if (uVar8 != 1) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      if (*E2 <= 0.0 && *E2 != 0.0) {
        for (i0 = 0; i0 < dF._4_4_; i0 = i0 + 1) {
          E2[i0] = -E2[i0];
        }
      }
      for (i1 = 0; i1 < dF._4_4_; i1 = i1 + 1) {
        if (E2[i1] <= 0.0 && E2[i1] != 0.0) {
          ON_SubDIncrementErrorCount();
          this_local._4_4_ = 0;
          goto LAB_0090aa39;
        }
      }
      *(double *)LP_capacity_local = *E2;
      *(double *)(LP_capacity_local + 8) = E2[1];
      q0._4_4_ = dF._4_4_;
      for (local_180 = 2; q0._4_4_ = q0._4_4_ - 1, local_180 <= q0._4_4_; local_180 = local_180 + 1)
      {
        if ((E2[local_180] != E2[q0._4_4_]) || (NAN(E2[local_180]) || NAN(E2[q0._4_4_]))) {
          local_290 = (E2[local_180] + E2[q0._4_4_]) * 0.5;
        }
        else {
          local_290 = E2[local_180];
        }
        *(double *)(LP_capacity_local + (ulong)local_180 * 8) = local_290;
      }
      if (2 < dF._0_4_) {
        LPsum = (double)(LP_capacity_local + (ulong)(dF._4_4_ - 1) * 8);
        q1 = (double *)(LP_capacity_local + 0x10);
        while (q1 < (ulong)LPsum) {
          *(double *)LPsum = *q1;
          LPsum = (double)((long)LPsum + -8);
          q1 = q1 + 1;
        }
        _i_5 = 0.0;
        for (lambda_local_1._4_4_ = 0; lambda_local_1._4_4_ < dF._4_4_;
            lambda_local_1._4_4_ = lambda_local_1._4_4_ + 1) {
          _i_5 = *(double *)(LP_capacity_local + (ulong)lambda_local_1._4_4_ * 8) + _i_5;
        }
        for (lambda_local_1._0_4_ = 0; lambda_local_1._0_4_ < dF._4_4_;
            lambda_local_1._0_4_ = lambda_local_1._0_4_ + 1) {
          *(double *)(LP_capacity_local + (ulong)lambda_local_1._0_4_ * 8) =
               *(double *)(LP_capacity_local + (ulong)lambda_local_1._0_4_ * 8) / _i_5;
        }
      }
    }
    if (L1_capacity_local != 0) {
      if (dF._0_4_ - 2 < 3 || dF._0_4_ == 5) {
        uVar8 = (*(code *)(&DAT_00a0ff7c + *(int *)(&DAT_00a0ff7c + (ulong)(dF._0_4_ - 2) * 4)))();
        return uVar8;
      }
      if (E1 == (double *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      dVar9 = SubdominantEigenvalue(this);
      if ((dVar9 <= 0.0) || (1.0 <= dVar9)) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      uVar8 = ON_GetEigenvectors(dF._4_4_,(double **)E1,true,dVar9,2,(double *)0x0,
                                 (double **)(eigenprecision + 1),&local_148,&lambda_local);
      if (uVar8 != 2) {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      dVar9 = E2[dF._4_4_ - 2];
      dVar2 = *(double *)(local_108 + (ulong)(dF._4_4_ - 2) * 8);
      dVar3 = E2[dF._4_4_ - 1];
      dVar4 = *(double *)(local_108 + (ulong)(dF._4_4_ - 1) * 8);
      dVar10 = dVar9 * dVar4 + -(dVar2 * dVar3);
      if ((dVar10 == 0.0) && (!NAN(dVar10))) {
        this_local._4_4_ = 0;
        goto LAB_0090aa39;
      }
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        local_2b8 = -dVar2 / dVar10;
      }
      else {
        local_2b8 = 0.0;
      }
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        local_2c8 = -dVar3 / dVar10;
      }
      else {
        local_2c8 = 0.0;
      }
      for (int_tol._4_4_ = 0; int_tol._4_4_ < dF._4_4_; int_tol._4_4_ = int_tol._4_4_ + 1) {
        *(double *)(L1_capacity_local + (ulong)int_tol._4_4_ * 8) =
             E2[int_tol._4_4_] * (dVar4 / dVar10) +
             *(double *)(local_108 + (ulong)int_tol._4_4_ * 8) * local_2c8;
        *(double *)((long)lambda + (ulong)int_tol._4_4_ * 8) =
             E2[int_tol._4_4_] * local_2b8 +
             *(double *)(local_108 + (ulong)int_tol._4_4_ * 8) * (dVar9 / dVar10);
      }
      for (i1_1 = 0; i1_1 < dF._4_4_; i1_1 = i1_1 + 1) {
        dVar9 = floor(*(double *)(L1_capacity_local + (ulong)i1_1 * 8) + 0.49);
        if (ABS(dVar9 - *(double *)(L1_capacity_local + (ulong)i1_1 * 8)) <= 1e-12) {
          *(double *)(L1_capacity_local + (ulong)i1_1 * 8) = dVar9;
        }
        dVar9 = floor(*(double *)((long)lambda + (ulong)i1_1 * 8) + 0.49);
        if (ABS(dVar9 - *(double *)((long)lambda + (ulong)i1_1 * 8)) <= 1e-12) {
          *(double *)((long)lambda + (ulong)i1_1 * 8) = dVar9;
        }
      }
      *(double *)L1_capacity_local = (double)dF._0_4_ * -0.25 * (double)dF._0_4_;
      *(undefined8 *)(L1_capacity_local + (ulong)(dF._4_4_ - 2) * 8) = 0x3ff0000000000000;
      *(undefined8 *)(L1_capacity_local + (ulong)(dF._4_4_ - 1) * 8) = 0;
      *(double *)lambda = (double)(dF._0_4_ * dF._0_4_);
      *(undefined8 *)((long)lambda + 0x10) = 0xc008000000000000;
      *(undefined8 *)((long)lambda + 0x18) = 0xc030000000000000;
      *(undefined8 *)((long)lambda + (ulong)(dF._4_4_ - 4) * 8) = 0xc030000000000000;
      *(undefined8 *)((long)lambda + (ulong)(dF._4_4_ - 3) * 8) = 0xc008000000000000;
      *(undefined8 *)((long)lambda + (ulong)(dF._4_4_ - 2) * 8) = 0;
      *(undefined8 *)((long)lambda + (ulong)(dF._4_4_ - 1) * 8) = 0x3ff0000000000000;
      i_8 = dF._4_4_ - 5;
      for (angle_index = 4; angle_index < i_8; angle_index = angle_index + 1) {
        dVar9 = *(double *)((long)lambda + (ulong)angle_index * 8);
        pdVar1 = (double *)((long)lambda + (ulong)i_8 * 8);
        if ((dVar9 != *pdVar1) || (NAN(dVar9) || NAN(*pdVar1))) {
          dVar9 = (*(double *)((long)lambda + (ulong)angle_index * 8) +
                  *(double *)((long)lambda + (ulong)i_8 * 8)) * 0.5;
          *(double *)((long)lambda + (ulong)angle_index * 8) = dVar9;
          *(double *)((long)lambda + (ulong)i_8 * 8) = dVar9;
        }
        i_8 = i_8 - 1;
      }
    }
    this_local._4_4_ = dF._4_4_;
LAB_0090aa39:
    ON_Matrix::~ON_Matrix((ON_Matrix *)&S);
    return this_local._4_4_;
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::GetSurfaceEvaluationCoefficients(
  double* LP,
  size_t LP_capacity,
  double* L1,
  size_t L1_capacity,
  double* L2,
  size_t L2_capacity
  ) const
{
  const double lambda = SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(0);

  
  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int F = FaceCount();
  if (F < 1)
    return ON_SUBD_RETURN_ERROR(0);
  const double dF = F;

  if ( 0 == LP_capacity)
    LP = nullptr;
  else if (LP_capacity < R || nullptr == LP)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L1_capacity)
    L1 = nullptr;
  else if (L1_capacity < R || nullptr == L1)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L2_capacity)
    L2 = nullptr;
  else if (L2_capacity < R || nullptr == L2)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if (nullptr == L1 || nullptr == L2)
  {
    // If one of L1 or L2 is null, then both must be null.
    if (nullptr != L1 || nullptr != L2)
    {
      return ON_SUBD_RETURN_ERROR(0);
    }
  }

  double p, q, y, z, cos0, cos1, sin0, sin1;
  bool b180degreeCorner = false;

  switch (VertexTag())
  {
  case ON_SubDVertexTag::Unset:
    break;

  case ON_SubDVertexTag::Smooth:
    if (R >= 5 && 1 == (R % 2))
    {
      if (nullptr != LP)
      {
        // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
        //
        // General case code works for R = 5 case: LP[5] = {2/7, 2/7, 1/14, 2/7, 1/14};
        LP[0] = dF / (5.0 + dF); // center point coefficient
        y = dF * (dF + 5.0);
        p = 4.0 / y; // edge point coefficient
        q = 1.0 / y; // face point coefficient
        for (unsigned int i = 1; i < R; i++)
        {
          LP[i] = p;
          i++;
          LP[i] = q;
        }
      }

      if (nullptr != L1)
      {
        if (5 == R)
        {
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
          //
          // Evaluation matrix has eigenvalues 1, 1/4, 1/4, -1/4, 1/8,
          // so we have a well defined limit point and 3 subdominant eigenvalues. 
          // The 1 eigenspace is 1 dimensional and spanned by (1,1,1,1,1).
          // The 1/4 eigenspace is 2 dimensional and spanned by (0,1,0,-1,0) and (0,0,1,0,-1).
          // The -1/4 eigenspace is 1 dimensional and spanned by (2,-1,0,-1,0).
          // The 1/8 is 1 dimensional and spanned by (1,1,-6,1,-6).
          // The general case code below will divide by zero when y is evaluated because cos1 = -1.
          // Turns out there is 1 well defined tangent vector (Q1-Q0) (quad points)

          // This is a "pseudo" limit tangent
          L1[0] = 0.0;
          L1[1] = 1.0;
          L1[2] = 0.0;
          L1[3] = -1.0;
          L1[4] = 0.0;

          // This is a bonafide limit tangent
          L2[0] = 0.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
          L2[4] = -1.0;
        }
        else
        {
          // cos0 = cos(2pi * 0/F)
          // sin0 = sin(2pi * 0/F)
          // cos1 = cos(2pi * 1/F)
          // sin1 = sin(2pi * 1/F)
          cos0 = 1.0;
          sin0 = 0.0;
          ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
          y = 2.0* (lambda - 0.125*(3.0 + cos1)) / (1.0 + cos1);
          L1[0] = 0.0;
          L1[1] = cos0;
          L2[0] = 0.0;
          L2[1] = sin0;
          unsigned int i = 2;
          for (;;)
          {
            L1[i] = y * (cos0 + cos1);
            L2[i] = y * (sin0 + sin1);
            i++;
            if (i == R)
              break;
            L1[i] = cos1;
            L2[i] = sin1;
            i++;
            cos0 = cos1;
            sin0 = sin1;
            ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
            // E0[] and E1[] values are symmetric and we could stop halfway and copy
            // current loop debugged and tested Feb 10, 2015
          }
        }
      }
      return R;
    }
    break;

  case ON_SubDVertexTag::Dart:
    if (1 == (R % 2))
    {
      ON_Matrix Sbuffer;
      const double*const* S = nullptr;
      double* E1 = nullptr;
      double* E2 = nullptr;
      if (F > 5)
      {
        if (false == Sbuffer.Create(R+2,R))
          return ON_SUBD_RETURN_ERROR(0);
        if (R != ON_SubDSectorType::GetSubdivisionMatrix(Sbuffer.m, R))
          return ON_SUBD_RETURN_ERROR(0);
        S = Sbuffer.m;
        E1 = Sbuffer.m[R];
        E2 = Sbuffer.m[R+1];
      }
      const double* termination_tolerances = nullptr;
      double* eigenvectors[2] = { E1, E2 };
      double eigenprecision[2] = { 0 };
      double eigenpivots[3] = { 0 };

      if (nullptr != LP)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          LP[0] = 8.0 / 31.0;
          LP[1] = 10.0 / 31.0;
          LP[2] = 3.0 / 62.0;
          LP[3] = 10.0 / 31.0;
          LP[4] = 3.0 / 62.0;
          break;

        case 3:
          LP[0] = 243/19.0;
          LP[1] = 130/19.0;
          LP[2] = 1.0;
          LP[3] = 120/19.0;
          LP[4] = 29/19.0;
          //LP[5] = 120/19.0;
          //LP[6] = 1.0;
          break;
        case 4:
          LP[0] = 752/29.0;
          LP[1] = 210/29.0;
          LP[2] = 1.0;
          LP[3] = 160/29.0;
          LP[4] = 44/29.0;
          LP[5] = 180/29.0; 
          //LP[6] = 44/29.0;
          //LP[7] = 160/29.0;
          //LP[8] = 1.0;
          break;
        case 5:
          LP[0] = 43.222764462468341719; 
          LP[1] = 7.4578211569974673376; 
          LP[2] = 1.0;
          LP[3] = 5.0843576860050653249; 
          LP[4] = 1.4771459186191773181; 
          LP[5] = 5.7257510234301278178;
          LP[6] = 1.5305953634045991926;
          //LP[7] = 5.7257510234301278178; 
          //LP[8] = 1.4771459186191773181;
          //LP[9] = 5.0843576860050653249;
          //LP[10] = 1.0000000000000000000;
          break;
        default:
          {
            // TODO
            // Finish general case formula for dominant eigenvector of Transpose(S)
            // Until I derive the formula, I can get the dominant eigenvector as the kernel of the matrix (S - I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = 1.0;
            const unsigned int lambda_multiplicity = 1;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);
            if (E1[0] < 0.0)
            {
              for ( unsigned int i = 0; i < R; i++ )
                E1[i] = -E1[i];
            }
            for (unsigned int i = 0; i < R; i++)
            {
              if (E1[i] < 0.0)
                return ON_SUBD_RETURN_ERROR(0);
            }
            LP[0] = E1[0];
            LP[1] = E1[1];
            unsigned int i0 = 2;
            unsigned int i1 = R-1;
            while (i0 <= i1)
            {
              LP[i0] = (E1[i0] == E1[i1]) ? E1[i0] : 0.5*(E1[i0] + E1[i1]);
              i0++;
              i1--;
            }
          }
          break;
        }

        if (F >= 3)
        {
          // The code below works for all F >= 3.
          const double* q0 = &LP[2];
          double* q1 = &LP[R - 1];
          while (q0 < q1)
            *q1-- = *q0++;
          double LPsum = 0.0;
          for (unsigned int i = 0; i < R; i++)
            LPsum += LP[i];
          for (unsigned int i = 0; i < R; i++)
            LP[i] /= LPsum;
        }
      }

      if (nullptr != L1)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          // The multiplicity of the subdominant eigen value is 1/2 and there is a single well defined
          // tangent in the limit surface. The other is a "fake" tangent that is close enough.

          // This is pseudo tangent associated with the eigenvalue 1/4
          // (1/4)^n goes to zero much faster than (1/2)^n, but ...
          // If the 5 points were translated so the limit point was zero 
          // and then a rotation about the origin were applied so bonafide limit tangent
          // was parallel to the x-axis (L2*(C,P0,Q0,P1,P1) = 0), then, as n goes to infinity,
          // Q0 - Q1 would be the farthest point from the x-axis.
          // the 5 
          L1[0] = 0.0;
          L1[1] = 0.0;
          L1[2] = -1.0;
          L1[3] = 0.0;
          L1[4] = 1.0;

          // This is a bonafide limit tangent associated with the eigenvalue 1/2.
          // I
          L2[0] = 4.0; // 2^2
          L2[1] = 6.0; 
          L2[2] = -1.0; 
          L2[3] = -8.0;
          L2[4] = -1.0;
          break;

        case 3:
          L1[0] = -9/4.0; // -L2[0]/4
          L1[1] = -3.0;
          L1[2] = 1/2.0;
          L1[3] = 3.0; 
          L1[4] = 3/4.0;
          L1[5] = 1;
          L1[6] = 0;

          L2[0] = 9.0; // 3^2
          L2[1] = 12.0; 
          L2[2] =  -3; 
          L2[3] = -16;  // -16  // -3, -16 = L2[3] = -16, -3
          L2[4] =  -3;  //  -3
          L2[5] = 0; 
          L2[6] = 1;
          break;

        case 4:
          L1[0] = -4.0;  // -L2[0]/4
          L1[1] = -7.0; 
          L1[2] = 1/2.0; 
          L1[3] = 3.0; 
          L1[4] = 3/2.0; 
          L1[5] = 4.0; 
          L1[6] = 1.0; 
          L1[7] = 1; 
          L1[8] = 0;

          L2[0] = 16.0; // 4^2
          L2[1] = 28.0;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -7.0;   // -3, -16, L2[4], -16, -3
          L2[5] = -16; 
          L2[6] =  -3;
          L2[7] = 0;
          L2[8] = 1;
          break;

        case 5:
          L1[0] = -6.25; // -L2[0]/4
          L1[1] = -14.208203932499369089;
          L1[2] = 0.50000000000000000000;
          L1[3] = 3.0000000000000000000;
          L1[4] = 1.9635254915624211362;
          L1[5] = 5.8541019662496845446;
          L1[6] = 2.3680339887498948482; 
          L1[7] = 4.6180339887498948482;
          L1[8] = 1.1545084971874737121;
          L1[9]  = 1;
          L1[10] = 0;

          L2[0] = 25.0; // 5^2
          L2[1] = 56.832815729997476357;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -9.4721359549995793928;
          L2[5] = -25.888543819998317571; // -3, -16, ..., L2[5], ..., -16, -3
          L2[6] = -9.4721359549995793928;
          L2[7] = -16; // -16 
          L2[8] =  -3; //  -3
          L2[9]  = 0;
          L2[10] = 1;
          break;

        default:
          {
            // TODO
            // Finish general case formula for subdominant eigenvectors of Transpose(S)
            // Until I derive the formula, I can get the subdominant eigenvectors as the kernel of the matrix (S - 1/2*I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = SubdominantEigenvalue();
            if (!(lambda_local > 0.0 && lambda_local < 1.0))
              return ON_SUBD_RETURN_ERROR(0);
            const unsigned int lambda_multiplicity = 2;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);

            const double E[2][2] = { { E1[R - 2], E2[R - 2] }, { E1[R - 1], E2[R - 1] } };

            const double det = E[0][0] * E[1][1] - E[0][1] * E[1][0];
            if (!(0.0 != det))
              return 0;

            const double EtoL[2][2] = {
              { E[1][1] / det, (0.0 == E[0][1]) ? 0.0 : (-E[0][1] / det) },
              { (0.0 == E[1][0]) ? 0.0 : (-E[1][0] / det), E[0][0] / det } };

            for (unsigned int i = 0; i < R; i++)
            {
              L1[i] = E1[i] * EtoL[0][0] + E2[i] * EtoL[1][0];
              L2[i] = E1[i] * EtoL[0][1] + E2[i] * EtoL[1][1];
            }

            const double int_tol = 1e-12;
            double x;
            for (unsigned int i = 0; i < R; i++)
            {
              x = floor(L1[i]+0.49);
              if (fabs(x - L1[i]) <= int_tol)
                L1[i] = x;
              x = floor(L2[i]+0.49);
              if (fabs(x - L2[i]) <= int_tol)
                L2[i] = x;
            }

            L1[0]     = -0.25*F*F;
            L1[R - 2] = 1.0;
            L1[R - 1] = 0.0;

            L2[0]   = F*F;
            L2[2]   = -3.0;
            L2[3]   = -16.0;
            L2[R-4] = -16.0;
            L2[R-3] =  -3.0;
            L2[R-2] =   0.0;
            L2[R-1] =   1.0;

            // L2[2, ..., R-1] is symmetric about L2[2+R/2]
            unsigned int i0 = 4;
            unsigned int i1 = R - 5;
            while (i0 < i1)
            {
              if (L2[i0] != L2[i1])
              {
                x = 0.5*(L2[i0] + L2[i1]);
                L2[i0] = x;
                L2[i1] = x;
              }
              i0++;
              i1--;
            }
          }
          break;
        }
      }
      return R;
    }
    break;


  case ON_SubDVertexTag::Corner:
    if (0 == (R % 2))
    {
      const unsigned int angle_index = CornerSectorAngleIndex();
      if ( 36 == angle_index && F > 1)
        b180degreeCorner = true; // use crease calculation
      else
      {
        // the corner angle alpha is not equal to pi (180 degrees)
        // so limit tangents will not be parallel
        // Lpev[]
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0

        L1[0] = -1.0; // center point coefficient
        L1[1] = 1.0; // initial boundary edge point coefficient
        L1[R - 1] = 0.0; // final boundary edge point coefficient

        // The sign of s is selected to keep the normal pointing "up".
        double s = (2 * angle_index <= ON_SubDSectorType::MaximumCornerAngleIndex) ? 1.0 : -1.0;
        L2[0] = -s; // center point coefficient
        L2[1] = 0.0; // initial boundary edge point coefficient
        L2[R - 1] = s; // final boundary edge point coefficient
        for (unsigned int i = 2; i + 1 < R; i++)
        {
          L1[i] = 0.0; // all face and interior edge coefficients = 0
          L2[i] = 0.0; // all face and interior edge coefficients = 0
        }

        if (36 == angle_index && 1 == F && 4 == R)
        {
          // This case has no good solution.
          L2[0] = -1.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
        }

        // TODO deal with 180 degree "corner case".  
        // L0 and L1 are the same as above. L2 will be similar to the crease case
        return R;
      }
    }
    if ( false == b180degreeCorner)
      break;

  case ON_SubDVertexTag::Crease:
    // NOTE: In the case when there are 2 crease edes and a single face,
    // The Catmull-Clark subdivision matrix is singular.
    if (0 == (R % 2))
    {
      // Lpev[]
      if (b180degreeCorner)
      {
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0
      }
      else
      {
        LP[0] = 2.0 / 3.0; // center point coefficient
        LP[1] = LP[R - 1] = 1.0 / 6.0;  // boundary edge point coefficients
        for (unsigned int i = 2; i + 1 < R; i++)
          LP[i++] = 0.0; // all face and interior edge coefficients = 0
      }

      // Using L1[] computes the tangent to the crease curve. This
      // curve is a uniform cubic spline with control points
      // (..., final crease edge point, center point, initial crease edge point, ...)
      L1[  0] =  0.0; // center point coefficient
      L1[  1] =  1.0; // initial boundary edge point coefficient
      L1[R-1] = -1.0; // final boundary edge point coefficient
      for (unsigned int i = 2; i+1 < R; i++)
        L1[i] = 0.0; // all face and interior edge coefficients = 0

      // Using L2[] computes a tangent that points from the limit point
      // into the subdivision surface.
      if (1 == F)
      {
        // This is the special where IsCatmullClarkCreaseOneFaceCase() returns true.
        // Catmull-Clark subdivision,
        // center vertex is a crease vertex,
        // one face and two crease edges.
        L2[0] = -2.0; // center point coefficients
        L2[1] =  1.0; // boundary edge point coefficient
        L2[2] =  0.0; // face point coefficient
        L2[3] =  1.0; // boundary edge point coefficient
      }
      else
      {
        // F faces, F-1 interior smooth edges and 2 boundary edges
        // theta = pi/F
        cos0 = 1.0; // cos(0)
        sin0 = 0.0; // sin(0)
        ON_SubDMatrix::EvaluateCosAndSin(1,F,&cos1,&sin1); // cos1 = cos(pi/F), sin1 = sin(pi/F)
        z = (1.0 + cos1) / sin1;
        L2[0] = -sin1;  // center point coefficients
        L2[1] = -0.25*z*(1.0 + 2.0*cos1); // initial boundary edge point coefficient
        L2[2] = 0.25*(sin0 + sin1); // first interior face point coefficient
        L2[R-1] = L2[1];            // final boundary edge point coefficient
        unsigned int i = 3;
        for (;;)
        {
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i/2 + 1, F, &cos1, &sin1);
          L2[i] = sin0; // interior edge point coefficient
          i++;
          L2[i] = 0.25*(sin0 + sin1); // interior face point coefficient
          i++;
          if ( i >= R-1 )
            break;
        }
      }

      return R;
    }
    break;
  }

  return ON_SUBD_RETURN_ERROR(0);
}